

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

ebur128_state * ebur128_init(uint channels,unsigned_long samplerate,int mode)

{
  int iVar1;
  ebur128_state *st_00;
  ebur128_state_internal *peVar2;
  double *pdVar3;
  unsigned_long *puVar4;
  double dVar5;
  ulong local_48;
  size_t j;
  uint i;
  ebur128_state *st;
  int errcode;
  int result;
  int mode_local;
  unsigned_long samplerate_local;
  uint channels_local;
  
  if ((channels == 0) || (0x40 < channels)) {
    return (ebur128_state *)0x0;
  }
  if ((samplerate < 0x10) || (0x2b1100 < samplerate)) {
    return (ebur128_state *)0x0;
  }
  st_00 = (ebur128_state *)malloc(0x18);
  if (st_00 == (ebur128_state *)0x0) {
    return (ebur128_state *)0x0;
  }
  peVar2 = (ebur128_state_internal *)malloc(0x140);
  st_00->d = peVar2;
  if (st_00->d == (ebur128_state_internal *)0x0) goto LAB_00105f6e;
  st_00->channels = channels;
  iVar1 = ebur128_init_channel_map(st_00);
  if (iVar1 == 0) {
    pdVar3 = (double *)malloc((ulong)channels << 3);
    st_00->d->sample_peak = pdVar3;
    if (st_00->d->sample_peak != (double *)0x0) {
      pdVar3 = (double *)malloc((ulong)channels << 3);
      st_00->d->prev_sample_peak = pdVar3;
      if (st_00->d->prev_sample_peak != (double *)0x0) {
        pdVar3 = (double *)malloc((ulong)channels << 3);
        st_00->d->true_peak = pdVar3;
        if (st_00->d->true_peak != (double *)0x0) {
          pdVar3 = (double *)malloc((ulong)channels << 3);
          st_00->d->prev_true_peak = pdVar3;
          if (st_00->d->prev_true_peak != (double *)0x0) {
            for (j._4_4_ = 0; j._4_4_ < channels; j._4_4_ = j._4_4_ + 1) {
              st_00->d->sample_peak[j._4_4_] = 0.0;
              st_00->d->prev_sample_peak[j._4_4_] = 0.0;
              st_00->d->true_peak[j._4_4_] = 0.0;
              st_00->d->prev_true_peak[j._4_4_] = 0.0;
            }
            st_00->d->use_histogram = (uint)((mode & 0x40U) != 0);
            st_00->d->history = 0xffffffffffffffff;
            st_00->samplerate = samplerate;
            st_00->d->samples_in_100ms = (st_00->samplerate + 5) / 10;
            st_00->mode = mode;
            if ((mode & 3U) == 3) {
              st_00->d->window = 3000;
LAB_0010599f:
              st_00->d->audio_data_frames = (st_00->samplerate * st_00->d->window) / 1000;
              if (st_00->d->audio_data_frames % st_00->d->samples_in_100ms != 0) {
                st_00->d->audio_data_frames =
                     (st_00->d->audio_data_frames + st_00->d->samples_in_100ms) -
                     st_00->d->audio_data_frames % st_00->d->samples_in_100ms;
              }
              pdVar3 = (double *)malloc(st_00->d->audio_data_frames * (ulong)st_00->channels * 8);
              st_00->d->audio_data = pdVar3;
              if (st_00->d->audio_data != (double *)0x0) {
                for (local_48 = 0; local_48 < st_00->d->audio_data_frames * (ulong)st_00->channels;
                    local_48 = local_48 + 1) {
                  st_00->d->audio_data[local_48] = 0.0;
                }
                iVar1 = ebur128_init_filter(st_00);
                if (iVar1 == 0) {
                  if (st_00->d->use_histogram == 0) {
                    st_00->d->block_energy_histogram = (unsigned_long *)0x0;
LAB_00105b79:
                    if (st_00->d->use_histogram == 0) {
                      st_00->d->short_term_block_energy_histogram = (unsigned_long *)0x0;
LAB_00105c0e:
                      (st_00->d->block_list).stqh_first = (ebur128_dq_entry *)0x0;
                      (st_00->d->block_list).stqh_last = &(st_00->d->block_list).stqh_first;
                      st_00->d->block_list_size = 0;
                      st_00->d->block_list_max = st_00->d->history / 100;
                      (st_00->d->short_term_block_list).stqh_first = (ebur128_dq_entry *)0x0;
                      (st_00->d->short_term_block_list).stqh_last =
                           &(st_00->d->short_term_block_list).stqh_first;
                      st_00->d->st_block_list_size = 0;
                      st_00->d->st_block_list_max = st_00->d->history / 3000;
                      st_00->d->short_term_frame_counter = 0;
                      iVar1 = ebur128_init_resampler(st_00);
                      if (iVar1 == 0) {
                        st_00->d->needed_frames = st_00->d->samples_in_100ms << 2;
                        st_00->d->audio_data_index = 0;
                        relative_gate_factor = pow(10.0,relative_gate / 10.0);
                        minus_twenty_decibels = pow(10.0,-2.0);
                        histogram_energy_boundaries[0] = pow(10.0,-6.930899999999999);
                        if (st_00->d->use_histogram != 0) {
                          for (j._4_4_ = 0; j._4_4_ < 1000; j._4_4_ = j._4_4_ + 1) {
                            dVar5 = pow(10.0,(((double)j._4_4_ / 10.0 - 69.95) + 0.691) / 10.0);
                            histogram_energies[j._4_4_] = dVar5;
                          }
                          for (j._4_4_ = 1; j._4_4_ < 0x3e9; j._4_4_ = j._4_4_ + 1) {
                            dVar5 = pow(10.0,(((double)j._4_4_ / 10.0 - 70.0) + 0.691) / 10.0);
                            histogram_energy_boundaries[j._4_4_] = dVar5;
                          }
                          return st_00;
                        }
                        return st_00;
                      }
                      free(st_00->d->short_term_block_energy_histogram);
                    }
                    else {
                      puVar4 = (unsigned_long *)malloc(8000);
                      st_00->d->short_term_block_energy_histogram = puVar4;
                      if (st_00->d->short_term_block_energy_histogram != (unsigned_long *)0x0) {
                        for (j._4_4_ = 0; j._4_4_ < 1000; j._4_4_ = j._4_4_ + 1) {
                          st_00->d->short_term_block_energy_histogram[j._4_4_] = 0;
                        }
                        goto LAB_00105c0e;
                      }
                    }
                    free(st_00->d->block_energy_histogram);
                  }
                  else {
                    puVar4 = (unsigned_long *)malloc(8000);
                    st_00->d->block_energy_histogram = puVar4;
                    if (st_00->d->block_energy_histogram != (unsigned_long *)0x0) {
                      for (j._4_4_ = 0; j._4_4_ < 1000; j._4_4_ = j._4_4_ + 1) {
                        st_00->d->block_energy_histogram[j._4_4_] = 0;
                      }
                      goto LAB_00105b79;
                    }
                  }
                  free(st_00->d->v);
                }
                free(st_00->d->audio_data);
              }
            }
            else if ((mode & 1U) == 1) {
              st_00->d->window = 400;
              goto LAB_0010599f;
            }
            free(st_00->d->prev_true_peak);
          }
          free(st_00->d->true_peak);
        }
        free(st_00->d->prev_sample_peak);
      }
      free(st_00->d->sample_peak);
    }
    free(st_00->d->channel_map);
  }
  free(st_00->d);
LAB_00105f6e:
  free(st_00);
  return (ebur128_state *)0x0;
}

Assistant:

ebur128_state*
ebur128_init(unsigned int channels, unsigned long samplerate, int mode) {
  int result;
  int errcode;
  ebur128_state* st;
  unsigned int i;
  size_t j;

  VALIDATE_CHANNELS_AND_SAMPLERATE(NULL);

  st = (ebur128_state*) malloc(sizeof(ebur128_state));
  CHECK_ERROR(!st, 0, exit)
  st->d = (struct ebur128_state_internal*) malloc(
      sizeof(struct ebur128_state_internal));
  CHECK_ERROR(!st->d, 0, free_state)
  st->channels = channels;
  errcode = ebur128_init_channel_map(st);
  CHECK_ERROR(errcode, 0, free_internal)

  st->d->sample_peak = (double*) malloc(channels * sizeof(double));
  CHECK_ERROR(!st->d->sample_peak, 0, free_channel_map)
  st->d->prev_sample_peak = (double*) malloc(channels * sizeof(double));
  CHECK_ERROR(!st->d->prev_sample_peak, 0, free_sample_peak)
  st->d->true_peak = (double*) malloc(channels * sizeof(double));
  CHECK_ERROR(!st->d->true_peak, 0, free_prev_sample_peak)
  st->d->prev_true_peak = (double*) malloc(channels * sizeof(double));
  CHECK_ERROR(!st->d->prev_true_peak, 0, free_true_peak)
  for (i = 0; i < channels; ++i) {
    st->d->sample_peak[i] = 0.0;
    st->d->prev_sample_peak[i] = 0.0;
    st->d->true_peak[i] = 0.0;
    st->d->prev_true_peak[i] = 0.0;
  }

  st->d->use_histogram = mode & EBUR128_MODE_HISTOGRAM ? 1 : 0;
  st->d->history = ULONG_MAX;
  st->samplerate = samplerate;
  st->d->samples_in_100ms = (st->samplerate + 5) / 10;
  st->mode = mode;
  if ((mode & EBUR128_MODE_S) == EBUR128_MODE_S) {
    st->d->window = 3000;
  } else if ((mode & EBUR128_MODE_M) == EBUR128_MODE_M) {
    st->d->window = 400;
  } else {
    goto free_prev_true_peak;
  }
  st->d->audio_data_frames = st->samplerate * st->d->window / 1000;
  if (st->d->audio_data_frames % st->d->samples_in_100ms) {
    /* round up to multiple of samples_in_100ms */
    st->d->audio_data_frames =
        (st->d->audio_data_frames + st->d->samples_in_100ms) -
        (st->d->audio_data_frames % st->d->samples_in_100ms);
  }
  st->d->audio_data = (double*) malloc(st->d->audio_data_frames * st->channels *
                                       sizeof(double));
  CHECK_ERROR(!st->d->audio_data, 0, free_prev_true_peak)
  for (j = 0; j < st->d->audio_data_frames * st->channels; ++j) {
    st->d->audio_data[j] = 0.0;
  }

  errcode = ebur128_init_filter(st);
  CHECK_ERROR(errcode, 0, free_audio_data)

  if (st->d->use_histogram) {
    st->d->block_energy_histogram =
        (unsigned long*) malloc(1000 * sizeof(unsigned long));
    CHECK_ERROR(!st->d->block_energy_histogram, 0, free_filter)
    for (i = 0; i < 1000; ++i) {
      st->d->block_energy_histogram[i] = 0;
    }
  } else {
    st->d->block_energy_histogram = NULL;
  }
  if (st->d->use_histogram) {
    st->d->short_term_block_energy_histogram =
        (unsigned long*) malloc(1000 * sizeof(unsigned long));
    CHECK_ERROR(!st->d->short_term_block_energy_histogram, 0,
                free_block_energy_histogram)
    for (i = 0; i < 1000; ++i) {
      st->d->short_term_block_energy_histogram[i] = 0;
    }
  } else {
    st->d->short_term_block_energy_histogram = NULL;
  }
  STAILQ_INIT(&st->d->block_list);
  st->d->block_list_size = 0;
  st->d->block_list_max = st->d->history / 100;
  STAILQ_INIT(&st->d->short_term_block_list);
  st->d->st_block_list_size = 0;
  st->d->st_block_list_max = st->d->history / 3000;
  st->d->short_term_frame_counter = 0;

  result = ebur128_init_resampler(st);
  CHECK_ERROR(result, 0, free_short_term_block_energy_histogram)

  /* the first block needs 400ms of audio data */
  st->d->needed_frames = st->d->samples_in_100ms * 4;
  /* start at the beginning of the buffer */
  st->d->audio_data_index = 0;

  /* initialize static constants */
  relative_gate_factor = pow(10.0, relative_gate / 10.0);
  minus_twenty_decibels = pow(10.0, -20.0 / 10.0);
  histogram_energy_boundaries[0] = pow(10.0, (-70.0 + 0.691) / 10.0);
  if (st->d->use_histogram) {
    for (i = 0; i < 1000; ++i) {
      histogram_energies[i] =
          pow(10.0, ((double) i / 10.0 - 69.95 + 0.691) / 10.0);
    }
    for (i = 1; i < 1001; ++i) {
      histogram_energy_boundaries[i] =
          pow(10.0, ((double) i / 10.0 - 70.0 + 0.691) / 10.0);
    }
  }

  return st;

free_short_term_block_energy_histogram:
  free(st->d->short_term_block_energy_histogram);
free_block_energy_histogram:
  free(st->d->block_energy_histogram);
free_filter:
  free(st->d->v);
free_audio_data:
  free(st->d->audio_data);
free_prev_true_peak:
  free(st->d->prev_true_peak);
free_true_peak:
  free(st->d->true_peak);
free_prev_sample_peak:
  free(st->d->prev_sample_peak);
free_sample_peak:
  free(st->d->sample_peak);
free_channel_map:
  free(st->d->channel_map);
free_internal:
  free(st->d);
free_state:
  free(st);
exit:
  return NULL;
}